

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

void __thiscall QSpanData::setupMatrix(QSpanData *this,QTransform *matrix,int bilin)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  TransformationType TVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  qreal *pqVar9;
  qreal *pqVar10;
  QTransform *pQVar11;
  long in_FS_OFFSET;
  byte bVar12;
  ulong uVar13;
  QTransform inv;
  QTransform delta;
  QTransform QStack_128;
  QTransform local_d8;
  qreal local_88 [9];
  undefined2 local_40;
  long local_38;
  
  bVar12 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pqVar9 = (qreal *)&DAT_0069ebb0;
  pqVar10 = local_88;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pqVar10 = *pqVar9;
    pqVar9 = pqVar9 + 1;
    pqVar10 = pqVar10 + 1;
  }
  pqVar9 = (qreal *)&DAT_0069ec50;
  pqVar10 = local_88;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pqVar10 = *pqVar9;
    pqVar9 = pqVar9 + 1;
    pqVar10 = pqVar10 + 1;
  }
  local_40 = 0xa800;
  QTransform::translate((QTransform *)local_88,1.52587890625e-05,1.52587890625e-05);
  pqVar9 = (qreal *)&DAT_0069ebb0;
  pQVar11 = &local_d8;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    pQVar11->m_matrix[0][0] = *pqVar9;
    pqVar9 = pqVar9 + (ulong)bVar12 * -2 + 1;
    pQVar11 = (QTransform *)((long)pQVar11 + ((ulong)bVar12 * -2 + 1) * 8);
  }
  QTransform::operator*(&QStack_128,(QTransform *)local_88,matrix);
  QTransform::inverted(&local_d8,&QStack_128,(bool *)0x0);
  this->m11 = local_d8.m_matrix[0][0];
  this->m12 = local_d8.m_matrix[0][1];
  this->m13 = local_d8.m_matrix[0][2];
  this->m21 = local_d8.m_matrix[1][0];
  this->m22 = local_d8.m_matrix[1][1];
  this->m23 = local_d8.m_matrix[1][2];
  this->m33 = local_d8.m_matrix[2][2];
  this->dx = local_d8.m_matrix[2][0];
  this->dy = local_d8.m_matrix[2][1];
  TVar4 = QTransform::type(&local_d8);
  this->field_0x89 = (char)TVar4;
  this->bilinear = bilin != 0;
  if ((local_d8._72_2_ & 0x3e0) == 0) {
    TVar4 = (ushort)local_d8._72_2_ & (TxProject|TxShear|TxRotate|TxScale|TxTranslate);
  }
  else {
    TVar4 = QTransform::type(&local_d8);
  }
  bVar6 = false;
  bVar7 = false;
  if ((int)TVar4 < 0x10) {
    dVar1 = this->m11 * this->m11 + this->m21 * this->m21;
    dVar2 = this->m12 * this->m12 + this->m22 * this->m22;
    auVar3._8_8_ = -(ulong)(dVar2 < 10000.0);
    auVar3._0_8_ = -(ulong)(dVar1 < 10000.0);
    uVar5 = movmskpd(TVar4,auVar3);
    bVar7 = bVar6;
    if (((((uVar5 & 1) != 0) && ((byte)((byte)uVar5 >> 1) != 0)) && (1.52587890625e-05 < dVar1)) &&
       (1.52587890625e-05 < dVar2)) {
      dVar1 = this->dx;
      uVar13 = -(ulong)(dVar1 < -dVar1);
      if (10000.0 <= (double)(~uVar13 & (ulong)dVar1 | (ulong)-dVar1 & uVar13)) {
        bVar7 = false;
      }
      else {
        dVar1 = this->dy;
        uVar13 = -(ulong)(dVar1 < -dVar1);
        bVar7 = (double)(~uVar13 & (ulong)dVar1 | (ulong)-dVar1 & uVar13) < 10000.0;
      }
    }
  }
  this->field_0x8a = this->field_0x8a & 0xfe | bVar7;
  adjustSpanMethods(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSpanData::setupMatrix(const QTransform &matrix, int bilin)
{
    QTransform delta;
    // make sure we round off correctly in qdrawhelper.cpp
    delta.translate(1.0 / 65536, 1.0 / 65536);

    QTransform inv = (delta * matrix).inverted();
    m11 = inv.m11();
    m12 = inv.m12();
    m13 = inv.m13();
    m21 = inv.m21();
    m22 = inv.m22();
    m23 = inv.m23();
    m33 = inv.m33();
    dx = inv.dx();
    dy = inv.dy();
    txop = inv.type();
    bilinear = bilin;

    const bool affine = inv.isAffine();
    const qreal f1 = m11 * m11 + m21 * m21;
    const qreal f2 = m12 * m12 + m22 * m22;
    fast_matrix = affine
        && f1 < 1e4
        && f2 < 1e4
        && f1 > (1.0 / 65536)
        && f2 > (1.0 / 65536)
        && qAbs(dx) < 1e4
        && qAbs(dy) < 1e4;

    adjustSpanMethods();
}